

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O1

void __thiscall Move::Move(Move *this,Position *initialPosition,NurseSolution *movedNurse)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  string local_48;
  
  uVar2 = *(undefined4 *)&initialPosition->field_0x4;
  uVar3 = *(undefined4 *)&initialPosition->shiftType;
  uVar4 = *(undefined4 *)((long)&initialPosition->shiftType + 4);
  (this->initialPosition).day = initialPosition->day;
  *(undefined4 *)&(this->initialPosition).field_0x4 = uVar2;
  *(undefined4 *)&(this->initialPosition).shiftType = uVar3;
  *(undefined4 *)((long)&(this->initialPosition).shiftType + 4) = uVar4;
  (this->initialPosition).skill._M_dataplus._M_p = (pointer)&(this->initialPosition).skill.field_2;
  pcVar1 = (initialPosition->skill)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->initialPosition).skill,pcVar1,
             pcVar1 + (initialPosition->skill)._M_string_length);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  Position::Position(&this->lastPosition,-1,(ShiftType *)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->movedNurse = movedNurse;
  this->tradedNurse = (NurseSolution *)0x0;
  return;
}

Assistant:

Move::Move(Position initialPosition, NurseSolution* movedNurse) : initialPosition(initialPosition), movedNurse(movedNurse){}